

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O1

void Gia_ManCollectSeq_rec(Gia_Man_t *p,int Id,Vec_Int_t *vRoots,Vec_Int_t *vObjs)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  uint uVar5;
  
  if (p->nTravIdsAlloc <= Id) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[Id] == p->nTravIds) {
    return;
  }
  p->pTravIds[Id] = p->nTravIds;
  if ((Id < 0) || (p->nObjs <= Id)) {
LAB_0071f904:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar3 = p->pObjs;
  uVar4 = *(ulong *)(pGVar3 + (uint)Id);
  uVar5 = (uint)uVar4;
  if ((uVar4 & 0x1fffffff) == 0x1fffffff || (int)uVar5 < 0) {
    if ((uVar5 & 0x9fffffff) == 0x9fffffff) {
      uVar5 = (uint)(uVar4 >> 0x20);
      if (p->vCis->nSize - p->nRegs <= (int)(uVar5 & 0x1fffffff)) {
        uVar5 = uVar5 & 0x1fffffff;
        iVar1 = p->vCis->nSize;
        if ((int)uVar5 < iVar1 - p->nRegs) {
          __assert_fail("Gia_ObjIsRo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar2 = p->vCos->nSize;
        uVar5 = (iVar2 - iVar1) + uVar5;
        if (((int)uVar5 < 0) || (iVar2 <= (int)uVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = p->vCos->pArray[uVar5];
        if ((iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0071f904;
        Vec_IntPush(vRoots,iVar1);
      }
      goto LAB_0071f8ec;
    }
    if ((-1 < (int)uVar5) || ((int)(uVar4 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDfs.c"
                    ,0x1e8,"void Gia_ManCollectSeq_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)")
      ;
    }
  }
  else {
    Gia_ManCollectSeq_rec(p,Id - (uVar5 & 0x1fffffff),vRoots,vObjs);
    uVar5 = *(uint *)&pGVar3[(uint)Id].field_0x4;
  }
  Gia_ManCollectSeq_rec(p,Id - (uVar5 & 0x1fffffff),vRoots,vObjs);
LAB_0071f8ec:
  Vec_IntPush(vObjs,Id);
  return;
}

Assistant:

void Gia_ManCollectSeq_rec( Gia_Man_t * p, int Id, Vec_Int_t * vRoots, Vec_Int_t * vObjs )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId( p, Id ) )
        return;
    Gia_ObjSetTravIdCurrentId( p, Id );
    pObj = Gia_ManObj( p, Id );
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManCollectSeq_rec( p, Gia_ObjFaninId0(pObj, Id), vRoots, vObjs );
        Gia_ManCollectSeq_rec( p, Gia_ObjFaninId1(pObj, Id), vRoots, vObjs );
    }
    else if ( Gia_ObjIsCi(pObj) )
    {
        if ( Gia_ObjIsRo(p, pObj) )
            Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
    }
    else if ( Gia_ObjIsCo(pObj) )
        Gia_ManCollectSeq_rec( p, Gia_ObjFaninId0(pObj, Id), vRoots, vObjs );
    else assert( 0 );
    Vec_IntPush( vObjs, Id );
}